

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

void __thiscall LexerTest_LexNan_Test::TestBody(LexerTest_LexNan_Test *this)

{
  internal iVar1;
  byte bVar2;
  internal extraout_var;
  internal extraout_var_00;
  internal extraout_var_01;
  internal extraout_var_02;
  internal extraout_var_03;
  ulong uVar3;
  char *in_R9;
  pointer *__ptr;
  string_view buffer;
  string_view buffer_00;
  string_view buffer_01;
  string_view buffer_02;
  string_view buffer_03;
  string_view buffer_04;
  string_view buffer_05;
  string_view buffer_06;
  string_view buffer_07;
  string_view buffer_08;
  string_view buffer_09;
  string_view buffer_10;
  string_view buffer_11;
  string_view buffer_12;
  string_view buffer_13;
  string_view buffer_14;
  string_view buffer_15;
  string_view buffer_16;
  string_view buffer_17;
  string_view buffer_18;
  string_view buffer_19;
  string_view buffer_20;
  string_view buffer_21;
  string_view buffer_22;
  string_view buffer_23;
  string_view buffer_24;
  string_view buffer_25;
  string_view buffer_26;
  string_view buffer_27;
  string_view buffer_28;
  string_view buffer_29;
  string_view buffer_30;
  string_view buffer_31;
  string_view buffer_32;
  string_view buffer_33;
  string_view buffer_34;
  string_view buffer_35;
  string_view buffer_36;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_680;
  bool local_660;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_658;
  bool local_638;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_630;
  bool local_610;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_608;
  bool local_5e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5e0;
  bool local_5c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5b8;
  bool local_598;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_590;
  bool local_570;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_568;
  bool local_548;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_540;
  bool local_520;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_518;
  bool local_4f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4f0;
  bool local_4d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4c8;
  bool local_4a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4a0;
  bool local_480;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_478;
  bool local_458;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_450;
  bool local_430;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_428;
  bool local_408;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_400;
  bool local_3e0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3d8;
  bool local_3b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3b0;
  bool local_390;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_388;
  bool local_368;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_360;
  bool local_340;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_338;
  bool local_318;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_310;
  bool local_2f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2e8;
  bool local_2c8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2c0;
  bool local_2a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_298;
  bool local_278;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_270;
  bool local_250;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_248;
  bool local_228;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_220;
  bool local_200;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1f8;
  bool local_1d8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1d0;
  bool local_1b0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1a8;
  bool local_188;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_180;
  bool local_160;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_158;
  bool local_138;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_130;
  bool local_110;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_108;
  bool local_e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e0;
  bool local_c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_b8;
  bool local_98;
  undefined1 local_90 [32];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_70;
  bool local_50;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  AssertHelper local_20;
  
  local_660 = false;
  buffer._M_str = "nan";
  buffer._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_90,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_680);
  ::wasm::WATParser::Lexer::takeF32();
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38[0] = extraout_var;
  if (local_50 == true) {
    local_50 = false;
    if (local_70._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_70._M_value + 0x10)) {
      operator_delete((void *)local_70._M_value._M_dataplus._M_p,local_70._16_8_ + 1);
    }
  }
  if ((pointer)local_90._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_90._8_8_,local_90._24_8_ - local_90._8_8_);
  }
  if (local_660 == true) {
    local_660 = false;
    if (local_680._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_680._M_value + 0x10)) {
      operator_delete((void *)local_680._M_value._M_dataplus._M_p,local_680._16_8_ + 1);
    }
  }
  iVar1 = local_38[0];
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,local_38,(AssertionResult *)"Lexer(\"nan\"sv).takeF32()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2be,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  if (iVar1 != (internal)0x0) {
    local_638 = false;
    buffer_00._M_str = "nan";
    buffer_00._M_len = 3;
    ::wasm::WATParser::Lexer::Lexer
              ((Lexer *)local_90,buffer_00,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_658);
    local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_50 == true) {
      local_50 = false;
      if (local_70._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_70._M_value + 0x10)) {
        operator_delete((void *)local_70._M_value._M_dataplus._M_p,local_70._16_8_ + 1);
      }
    }
    if ((pointer)local_90._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_90._8_8_,local_90._24_8_ - local_90._8_8_);
    }
    if (local_638 == true) {
      local_638 = false;
      if (local_658._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_658._M_value + 0x10)) {
        operator_delete((void *)local_658._M_value._M_dataplus._M_p,local_658._16_8_ + 1);
      }
    }
    iVar1 = local_38[0];
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,local_38,(AssertionResult *)"Lexer(\"nan\"sv).takeF64()","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x2bf,(char *)local_90._0_8_);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
      }
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    if (iVar1 != (internal)0x0) {
      local_610 = false;
      buffer_01._M_str = "+nan";
      buffer_01._M_len = 4;
      ::wasm::WATParser::Lexer::Lexer
                ((Lexer *)local_90,buffer_01,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_630);
      ::wasm::WATParser::Lexer::takeF32();
      local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_38[0] = extraout_var_00;
      if (local_50 == true) {
        local_50 = false;
        if (local_70._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_70._M_value + 0x10)) {
          operator_delete((void *)local_70._M_value._M_dataplus._M_p,local_70._16_8_ + 1);
        }
      }
      if ((pointer)local_90._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_90._8_8_,local_90._24_8_ - local_90._8_8_);
      }
      if (local_610 == true) {
        local_610 = false;
        if (local_630._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_630._M_value + 0x10))
        {
          operator_delete((void *)local_630._M_value._M_dataplus._M_p,local_630._16_8_ + 1);
        }
      }
      iVar1 = local_38[0];
      if (local_38[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_28);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_90,local_38,(AssertionResult *)"Lexer(\"+nan\"sv).takeF32()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x2c1,(char *)local_90._0_8_);
        testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
        testing::internal::AssertHelper::~AssertHelper(&local_20);
        if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
        }
        if (local_28._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_28._M_head_impl + 8))();
        }
      }
      if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_30,local_30);
      }
      if (iVar1 != (internal)0x0) {
        local_5e8 = false;
        buffer_02._M_str = "+nan";
        buffer_02._M_len = 4;
        ::wasm::WATParser::Lexer::Lexer
                  ((Lexer *)local_90,buffer_02,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_608);
        local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
        local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_50 == true) {
          local_50 = false;
          if (local_70._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_70._M_value + 0x10))
          {
            operator_delete((void *)local_70._M_value._M_dataplus._M_p,local_70._16_8_ + 1);
          }
        }
        if ((pointer)local_90._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_90._8_8_,local_90._24_8_ - local_90._8_8_);
        }
        if (local_5e8 == true) {
          local_5e8 = false;
          if (local_608._M_value._M_dataplus._M_p !=
              (_Alloc_hider)((long)&local_608._M_value + 0x10)) {
            operator_delete((void *)local_608._M_value._M_dataplus._M_p,local_608._16_8_ + 1);
          }
        }
        iVar1 = local_38[0];
        if (local_38[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_28);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_90,local_38,(AssertionResult *)"Lexer(\"+nan\"sv).takeF64()",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_20,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x2c2,(char *)local_90._0_8_);
          testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
          testing::internal::AssertHelper::~AssertHelper(&local_20);
          if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
            operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
          }
          if (local_28._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_28._M_head_impl + 8))();
          }
        }
        if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_30,local_30);
        }
        if (iVar1 != (internal)0x0) {
          local_5c0 = false;
          buffer_03._M_str = "-nan";
          buffer_03._M_len = 4;
          ::wasm::WATParser::Lexer::Lexer
                    ((Lexer *)local_90,buffer_03,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_5e0);
          ::wasm::WATParser::Lexer::takeF32();
          local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_38[0] = extraout_var_01;
          if (local_50 == true) {
            local_50 = false;
            if (local_70._M_value._M_dataplus._M_p !=
                (_Alloc_hider)((long)&local_70._M_value + 0x10)) {
              operator_delete((void *)local_70._M_value._M_dataplus._M_p,local_70._16_8_ + 1);
            }
          }
          if ((pointer)local_90._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_90._8_8_,local_90._24_8_ - local_90._8_8_);
          }
          if (local_5c0 == true) {
            local_5c0 = false;
            if (local_5e0._M_value._M_dataplus._M_p !=
                (_Alloc_hider)((long)&local_5e0._M_value + 0x10)) {
              operator_delete((void *)local_5e0._M_value._M_dataplus._M_p,local_5e0._16_8_ + 1);
            }
          }
          iVar1 = local_38[0];
          if (local_38[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_28);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_90,local_38,(AssertionResult *)"Lexer(\"-nan\"sv).takeF32()",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_20,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x2c4,(char *)local_90._0_8_);
            testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
            testing::internal::AssertHelper::~AssertHelper(&local_20);
            if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
              operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
            }
            if (local_28._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_28._M_head_impl + 8))();
            }
          }
          if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_30,local_30);
          }
          if (iVar1 != (internal)0x0) {
            local_598 = false;
            buffer_04._M_str = "-nan";
            buffer_04._M_len = 4;
            ::wasm::WATParser::Lexer::Lexer
                      ((Lexer *)local_90,buffer_04,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_5b8);
            local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
            local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_50 == true) {
              local_50 = false;
              if (local_70._M_value._M_dataplus._M_p !=
                  (_Alloc_hider)((long)&local_70._M_value + 0x10)) {
                operator_delete((void *)local_70._M_value._M_dataplus._M_p,local_70._16_8_ + 1);
              }
            }
            if ((pointer)local_90._8_8_ != (pointer)0x0) {
              operator_delete((void *)local_90._8_8_,local_90._24_8_ - local_90._8_8_);
            }
            if (local_598 == true) {
              local_598 = false;
              if (local_5b8._M_value._M_dataplus._M_p !=
                  (_Alloc_hider)((long)&local_5b8._M_value + 0x10)) {
                operator_delete((void *)local_5b8._M_value._M_dataplus._M_p,local_5b8._16_8_ + 1);
              }
            }
            iVar1 = local_38[0];
            if (local_38[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_28);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_90,local_38,
                         (AssertionResult *)"Lexer(\"-nan\"sv).takeF64()","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_20,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x2c5,(char *)local_90._0_8_);
              testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
              testing::internal::AssertHelper::~AssertHelper(&local_20);
              if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
              }
              if (local_28._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_28._M_head_impl + 8))();
              }
            }
            if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_30,local_30);
            }
            if (iVar1 != (internal)0x0) {
              local_570 = false;
              buffer_05._M_str = "nan:0x01";
              buffer_05._M_len = 8;
              ::wasm::WATParser::Lexer::Lexer
                        ((Lexer *)local_90,buffer_05,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_590);
              ::wasm::WATParser::Lexer::takeF32();
              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_38[0] = extraout_var_02;
              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
              if (local_570 == true) {
                local_570 = false;
                if (local_590._M_value._M_dataplus._M_p !=
                    (_Alloc_hider)((long)&local_590._M_value + 0x10)) {
                  operator_delete((void *)local_590._M_value._M_dataplus._M_p,local_590._16_8_ + 1);
                }
              }
              iVar1 = local_38[0];
              if (local_38[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_28);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,local_38,
                           (AssertionResult *)"Lexer(\"nan:0x01\"sv).takeF32()","false","true",in_R9
                          );
                testing::internal::AssertHelper::AssertHelper
                          (&local_20,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x2c7,(char *)local_90._0_8_);
                testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
                testing::internal::AssertHelper::~AssertHelper(&local_20);
                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                  operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
                }
                if (local_28._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              if (iVar1 != (internal)0x0) {
                local_548 = false;
                buffer_06._M_str = "nan:0x01";
                buffer_06._M_len = 8;
                ::wasm::WATParser::Lexer::Lexer
                          ((Lexer *)local_90,buffer_06,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_568);
                local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                if (local_548 == true) {
                  local_548 = false;
                  if (local_568._M_value._M_dataplus._M_p !=
                      (_Alloc_hider)((long)&local_568._M_value + 0x10)) {
                    operator_delete((void *)local_568._M_value._M_dataplus._M_p,local_568._16_8_ + 1
                                   );
                  }
                }
                iVar1 = local_38[0];
                if (local_38[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_28);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_90,local_38,
                             (AssertionResult *)"Lexer(\"nan:0x01\"sv).takeF64()","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_20,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x2c8,(char *)local_90._0_8_);
                  testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
                  testing::internal::AssertHelper::~AssertHelper(&local_20);
                  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                    operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
                  }
                  if (local_28._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                  }
                }
                if (local_30 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_30,local_30);
                }
                if (iVar1 != (internal)0x0) {
                  local_520 = false;
                  buffer_07._M_str = "+nan:0x01";
                  buffer_07._M_len = 9;
                  ::wasm::WATParser::Lexer::Lexer
                            ((Lexer *)local_90,buffer_07,
                             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_540);
                  ::wasm::WATParser::Lexer::takeF32();
                  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  local_38[0] = extraout_var_03;
                  ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                  if (local_520 == true) {
                    local_520 = false;
                    if (local_540._M_value._M_dataplus._M_p !=
                        (_Alloc_hider)((long)&local_540._M_value + 0x10)) {
                      operator_delete((void *)local_540._M_value._M_dataplus._M_p,
                                      local_540._16_8_ + 1);
                    }
                  }
                  iVar1 = local_38[0];
                  if (local_38[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_28);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_90,local_38,
                               (AssertionResult *)"Lexer(\"+nan:0x01\"sv).takeF32()","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_20,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x2ca,(char *)local_90._0_8_);
                    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
                    testing::internal::AssertHelper::~AssertHelper(&local_20);
                    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                      operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
                    }
                    if (local_28._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_28._M_head_impl + 8))();
                    }
                  }
                  if (local_30 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_30,local_30);
                  }
                  if (iVar1 != (internal)0x0) {
                    local_4f8 = false;
                    buffer_08._M_str = "+nan:0x01";
                    buffer_08._M_len = 9;
                    ::wasm::WATParser::Lexer::Lexer
                              ((Lexer *)local_90,buffer_08,
                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_518);
                    local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                    ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                    if (local_4f8 == true) {
                      local_4f8 = false;
                      if (local_518._M_value._M_dataplus._M_p !=
                          (_Alloc_hider)((long)&local_518._M_value + 0x10)) {
                        operator_delete((void *)local_518._M_value._M_dataplus._M_p,
                                        local_518._16_8_ + 1);
                      }
                    }
                    iVar1 = local_38[0];
                    if (local_38[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_28);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_90,local_38,
                                 (AssertionResult *)"Lexer(\"+nan:0x01\"sv).takeF64()","false",
                                 "true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_20,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x2cb,(char *)local_90._0_8_);
                      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
                      testing::internal::AssertHelper::~AssertHelper(&local_20);
                      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                        operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
                      }
                      if (local_28._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_28._M_head_impl + 8))();
                      }
                    }
                    if (local_30 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_30,local_30);
                    }
                    if (iVar1 != (internal)0x0) {
                      local_4d0 = false;
                      buffer_09._M_str = "-nan:0x01";
                      buffer_09._M_len = 9;
                      ::wasm::WATParser::Lexer::Lexer
                                ((Lexer *)local_90,buffer_09,
                                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_4f0);
                      local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                      local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                      if (local_4d0 == true) {
                        local_4d0 = false;
                        if (local_4f0._M_value._M_dataplus._M_p !=
                            (_Alloc_hider)((long)&local_4f0._M_value + 0x10)) {
                          operator_delete((void *)local_4f0._M_value._M_dataplus._M_p,
                                          local_4f0._16_8_ + 1);
                        }
                      }
                      iVar1 = local_38[0];
                      if (local_38[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_28);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_90,local_38,
                                   (AssertionResult *)"Lexer(\"-nan:0x01\"sv).takeF64()","false",
                                   "true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_20,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x2cd,(char *)local_90._0_8_);
                        testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
                        testing::internal::AssertHelper::~AssertHelper(&local_20);
                        if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                          operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
                        }
                        if (local_28._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_28._M_head_impl + 8))();
                        }
                      }
                      if (local_30 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_30,local_30);
                      }
                      if (iVar1 != (internal)0x0) {
                        local_4a8 = false;
                        buffer_10._M_str = "-nan:0x01";
                        buffer_10._M_len = 9;
                        ::wasm::WATParser::Lexer::Lexer
                                  ((Lexer *)local_90,buffer_10,
                                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_4c8);
                        local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                        local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0;
                        ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                        if (local_4a8 == true) {
                          local_4a8 = false;
                          if (local_4c8._M_value._M_dataplus._M_p !=
                              (_Alloc_hider)((long)&local_4c8._M_value + 0x10)) {
                            operator_delete((void *)local_4c8._M_value._M_dataplus._M_p,
                                            local_4c8._16_8_ + 1);
                          }
                        }
                        iVar1 = local_38[0];
                        if (local_38[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_28);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_90,local_38,
                                     (AssertionResult *)"Lexer(\"-nan:0x01\"sv).takeF64()","false",
                                     "true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_20,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x2ce,(char *)local_90._0_8_);
                          testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_20);
                          if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                            operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
                          }
                          if (local_28._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_28._M_head_impl + 8))();
                          }
                        }
                        if (local_30 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_30,local_30);
                        }
                        if (iVar1 != (internal)0x0) {
                          local_480 = false;
                          buffer_11._M_str = "nan:0x1234";
                          buffer_11._M_len = 10;
                          ::wasm::WATParser::Lexer::Lexer
                                    ((Lexer *)local_90,buffer_11,
                                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_4a0);
                          local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                          local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x0;
                          ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                          if (local_480 == true) {
                            local_480 = false;
                            if (local_4a0._M_value._M_dataplus._M_p !=
                                (_Alloc_hider)((long)&local_4a0._M_value + 0x10)) {
                              operator_delete((void *)local_4a0._M_value._M_dataplus._M_p,
                                              local_4a0._16_8_ + 1);
                            }
                          }
                          iVar1 = local_38[0];
                          if (local_38[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_28);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_90,local_38,
                                       (AssertionResult *)"Lexer(\"nan:0x1234\"sv).takeF64()",
                                       "false","true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_20,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x2d0,(char *)local_90._0_8_);
                            testing::internal::AssertHelper::operator=
                                      (&local_20,(Message *)&local_28);
                            testing::internal::AssertHelper::~AssertHelper(&local_20);
                            if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                              operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
                            }
                            if (local_28._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_28._M_head_impl + 8))();
                            }
                          }
                          if (local_30 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_30,local_30);
                          }
                          if (iVar1 != (internal)0x0) {
                            local_458 = false;
                            buffer_12._M_str = "nan:0x1234";
                            buffer_12._M_len = 10;
                            ::wasm::WATParser::Lexer::Lexer
                                      ((Lexer *)local_90,buffer_12,
                                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_478);
                            local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                            local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x0;
                            ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                            if (local_458 == true) {
                              local_458 = false;
                              if (local_478._M_value._M_dataplus._M_p !=
                                  (_Alloc_hider)((long)&local_478._M_value + 0x10)) {
                                operator_delete((void *)local_478._M_value._M_dataplus._M_p,
                                                local_478._16_8_ + 1);
                              }
                            }
                            iVar1 = local_38[0];
                            if (local_38[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_28);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)local_90,local_38,
                                         (AssertionResult *)"Lexer(\"nan:0x1234\"sv).takeF64()",
                                         "false","true",in_R9);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_20,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x2d1,(char *)local_90._0_8_);
                              testing::internal::AssertHelper::operator=
                                        (&local_20,(Message *)&local_28);
                              testing::internal::AssertHelper::~AssertHelper(&local_20);
                              if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1))
                                ;
                              }
                              if (local_28._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_28._M_head_impl + 8))();
                              }
                            }
                            if (local_30 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_30,local_30);
                            }
                            if (iVar1 != (internal)0x0) {
                              local_430 = false;
                              buffer_13._M_str = "nan:0xf_ffff_ffff_ffff";
                              buffer_13._M_len = 0x16;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_13,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_450);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 >> 0x20 & 1) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_430 == true) {
                                local_430 = false;
                                if (local_450._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_450._M_value + 0x10)) {
                                  operator_delete((void *)local_450._M_value._M_dataplus._M_p,
                                                  local_450._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0xf_ffff_ffff_ffff\"sv).takeF32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d3,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_408 = false;
                              buffer_14._M_str = "nan:0xf_ffff_ffff_ffff";
                              buffer_14._M_len = 0x16;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_14,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_428);
                              local_38[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_408 == true) {
                                local_408 = false;
                                if (local_428._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_428._M_value + 0x10)) {
                                  operator_delete((void *)local_428._M_value._M_dataplus._M_p,
                                                  local_428._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0xf_ffff_ffff_ffff\"sv).takeF64()","false",
                                           "true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d4,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_3e0 = false;
                              buffer_15._M_str = "nanjunk";
                              buffer_15._M_len = 7;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_15,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_400);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_3e0 == true) {
                                local_3e0 = false;
                                if (local_400._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_400._M_value + 0x10)) {
                                  operator_delete((void *)local_400._M_value._M_dataplus._M_p,
                                                  local_400._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nanjunk\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d6,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_3b8 = false;
                              buffer_16._M_str = "nanjunk";
                              buffer_16._M_len = 7;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_16,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_3d8);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar2 & 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_3b8 == true) {
                                local_3b8 = false;
                                if (local_3d8._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_3d8._M_value + 0x10)) {
                                  operator_delete((void *)local_3d8._M_value._M_dataplus._M_p,
                                                  local_3d8._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nanjunk\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d7,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_390 = false;
                              buffer_17._M_str = "nan:";
                              buffer_17._M_len = 4;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_17,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_3b0);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_390 == true) {
                                local_390 = false;
                                if (local_3b0._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_3b0._M_value + 0x10)) {
                                  operator_delete((void *)local_3b0._M_value._M_dataplus._M_p,
                                                  local_3b0._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:\"sv).takeF32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d9,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_368 = false;
                              buffer_18._M_str = "nan:";
                              buffer_18._M_len = 4;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_18,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_388);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar2 & 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_368 == true) {
                                local_368 = false;
                                if (local_388._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_388._M_value + 0x10)) {
                                  operator_delete((void *)local_388._M_value._M_dataplus._M_p,
                                                  local_388._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:\"sv).takeF64()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2da,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_340 = false;
                              buffer_19._M_str = "nan:0x";
                              buffer_19._M_len = 6;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_19,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_360);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_340 == true) {
                                local_340 = false;
                                if (local_360._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_360._M_value + 0x10)) {
                                  operator_delete((void *)local_360._M_value._M_dataplus._M_p,
                                                  local_360._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0x\"sv).takeF32()","true"
                                           ,"false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2dc,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_318 = false;
                              buffer_20._M_str = "nan:0x";
                              buffer_20._M_len = 6;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_20,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_338);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar2 & 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_318 == true) {
                                local_318 = false;
                                if (local_338._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_338._M_value + 0x10)) {
                                  operator_delete((void *)local_338._M_value._M_dataplus._M_p,
                                                  local_338._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0x\"sv).takeF64()","true"
                                           ,"false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2dd,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_2f0 = false;
                              buffer_21._M_str = "nan:0xjunk";
                              buffer_21._M_len = 10;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_21,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_310);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_2f0 == true) {
                                local_2f0 = false;
                                if (local_310._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_310._M_value + 0x10)) {
                                  operator_delete((void *)local_310._M_value._M_dataplus._M_p,
                                                  local_310._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0xjunk\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2df,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_2c8 = false;
                              buffer_22._M_str = "nan:0xjunk";
                              buffer_22._M_len = 10;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_22,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_2e8);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar2 & 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_2c8 == true) {
                                local_2c8 = false;
                                if (local_2e8._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_2e8._M_value + 0x10)) {
                                  operator_delete((void *)local_2e8._M_value._M_dataplus._M_p,
                                                  local_2e8._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0xjunk\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e0,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_2a0 = false;
                              buffer_23._M_str = "nan:-0x1";
                              buffer_23._M_len = 8;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_23,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_2c0);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_2a0 == true) {
                                local_2a0 = false;
                                if (local_2c0._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_2c0._M_value + 0x10)) {
                                  operator_delete((void *)local_2c0._M_value._M_dataplus._M_p,
                                                  local_2c0._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:-0x1\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e2,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_278 = false;
                              buffer_24._M_str = "nan:-0x1";
                              buffer_24._M_len = 8;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_24,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_298);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar2 & 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_278 == true) {
                                local_278 = false;
                                if (local_298._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_298._M_value + 0x10)) {
                                  operator_delete((void *)local_298._M_value._M_dataplus._M_p,
                                                  local_298._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:-0x1\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e3,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_250 = false;
                              buffer_25._M_str = "nan:+0x1";
                              buffer_25._M_len = 8;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_25,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_270);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_250 == true) {
                                local_250 = false;
                                if (local_270._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_270._M_value + 0x10)) {
                                  operator_delete((void *)local_270._M_value._M_dataplus._M_p,
                                                  local_270._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:+0x1\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e5,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_228 = false;
                              buffer_26._M_str = "nan:+0x1";
                              buffer_26._M_len = 8;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_26,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_248);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar2 & 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_228 == true) {
                                local_228 = false;
                                if (local_248._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_248._M_value + 0x10)) {
                                  operator_delete((void *)local_248._M_value._M_dataplus._M_p,
                                                  local_248._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:+0x1\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e6,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_200 = false;
                              buffer_27._M_str = "nan:0x0";
                              buffer_27._M_len = 7;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_27,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_220);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_200 == true) {
                                local_200 = false;
                                if (local_220._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_220._M_value + 0x10)) {
                                  operator_delete((void *)local_220._M_value._M_dataplus._M_p,
                                                  local_220._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0x0\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e8,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_1d8 = false;
                              buffer_28._M_str = "nan:0x0";
                              buffer_28._M_len = 7;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_28,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_1f8);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar2 & 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_1d8 == true) {
                                local_1d8 = false;
                                if (local_1f8._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_1f8._M_value + 0x10)) {
                                  operator_delete((void *)local_1f8._M_value._M_dataplus._M_p,
                                                  local_1f8._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"nan:0x0\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e9,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_1b0 = false;
                              buffer_29._M_str = "nan:0x10_0000_0000_0000";
                              buffer_29._M_len = 0x17;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_29,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_1d0);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_1b0 == true) {
                                local_1b0 = false;
                                if (local_1d0._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_1d0._M_value + 0x10)) {
                                  operator_delete((void *)local_1d0._M_value._M_dataplus._M_p,
                                                  local_1d0._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x10_0000_0000_0000\"sv).takeF32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2eb,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_188 = false;
                              buffer_30._M_str = "nan:0x10_0000_0000_0000";
                              buffer_30._M_len = 0x17;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_30,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_1a8);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar2 & 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_188 == true) {
                                local_188 = false;
                                if (local_1a8._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_1a8._M_value + 0x10)) {
                                  operator_delete((void *)local_1a8._M_value._M_dataplus._M_p,
                                                  local_1a8._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x10_0000_0000_0000\"sv).takeF64()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2ec,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_160 = false;
                              buffer_31._M_str = "nan:0x1_0000_0000_0000_0000";
                              buffer_31._M_len = 0x1b;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_31,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_180);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_160 == true) {
                                local_160 = false;
                                if (local_180._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_180._M_value + 0x10)) {
                                  operator_delete((void *)local_180._M_value._M_dataplus._M_p,
                                                  local_180._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x1_0000_0000_0000_0000\"sv).takeF32()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2ee,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_138 = false;
                              buffer_32._M_str = "nan:0x1_0000_0000_0000_0000";
                              buffer_32._M_len = 0x1b;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_32,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_158);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar2 & 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_138 == true) {
                                local_138 = false;
                                if (local_158._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_158._M_value + 0x10)) {
                                  operator_delete((void *)local_158._M_value._M_dataplus._M_p,
                                                  local_158._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x1_0000_0000_0000_0000\"sv).takeF64()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2ef,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_110 = false;
                              buffer_33._M_str = "NAN";
                              buffer_33._M_len = 3;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_33,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_130);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_110 == true) {
                                local_110 = false;
                                if (local_130._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_130._M_value + 0x10)) {
                                  operator_delete((void *)local_130._M_value._M_dataplus._M_p,
                                                  local_130._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"NAN\"sv).takeF32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f1,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_e8 = false;
                              buffer_34._M_str = "NAN";
                              buffer_34._M_len = 3;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_34,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_108);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(~bVar2 & 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_e8 == true) {
                                local_e8 = false;
                                if (local_108._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_108._M_value + 0x10)) {
                                  operator_delete((void *)local_108._M_value._M_dataplus._M_p,
                                                  local_108._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"NAN\"sv).takeF64()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f2,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_c0 = false;
                              buffer_35._M_str = "NaN";
                              buffer_35._M_len = 3;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_35,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_e0);
                              uVar3 = ::wasm::WATParser::Lexer::takeF32();
                              local_38[0] = (internal)((uVar3 & 0x100000000) == 0);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_c0 == true) {
                                local_c0 = false;
                                if (local_e0._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_e0._M_value + 0x10)) {
                                  operator_delete((void *)local_e0._M_value._M_dataplus._M_p,
                                                  local_e0._16_8_ + 1);
                                }
                              }
                              if (local_38[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"NaN\"sv).takeF32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f4,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (local_30 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_30,local_30);
                              }
                              local_98 = false;
                              buffer_36._M_str = "NaN";
                              buffer_36._M_len = 3;
                              ::wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_90,buffer_36,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_b8);
                              bVar2 = ::wasm::WATParser::Lexer::takeF64();
                              local_38[0] = (internal)(bVar2 & 1 ^ 1);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_90);
                              if (local_98 == true) {
                                local_98 = false;
                                if (local_b8._M_value._M_dataplus._M_p !=
                                    (_Alloc_hider)((long)&local_b8._M_value + 0x10)) {
                                  operator_delete((void *)local_b8._M_value._M_dataplus._M_p,
                                                  local_b8._16_8_ + 1);
                                }
                              }
                              if ((bVar2 & 1) != 0) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_90,local_38,
                                           (AssertionResult *)"Lexer(\"NaN\"sv).takeF64()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f5,(char *)local_90._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_28);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
                                  operator_delete((void *)local_90._0_8_,
                                                  (ulong)(local_90._16_8_ + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                                if (local_30 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_30,local_30);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(LexerTest, LexNan) {
  ASSERT_TRUE(Lexer("nan"sv).takeF32());
  ASSERT_TRUE(Lexer("nan"sv).takeF64());

  ASSERT_TRUE(Lexer("+nan"sv).takeF32());
  ASSERT_TRUE(Lexer("+nan"sv).takeF64());

  ASSERT_TRUE(Lexer("-nan"sv).takeF32());
  ASSERT_TRUE(Lexer("-nan"sv).takeF64());

  ASSERT_TRUE(Lexer("nan:0x01"sv).takeF32());
  ASSERT_TRUE(Lexer("nan:0x01"sv).takeF64());

  ASSERT_TRUE(Lexer("+nan:0x01"sv).takeF32());
  ASSERT_TRUE(Lexer("+nan:0x01"sv).takeF64());

  ASSERT_TRUE(Lexer("-nan:0x01"sv).takeF64());
  ASSERT_TRUE(Lexer("-nan:0x01"sv).takeF64());

  ASSERT_TRUE(Lexer("nan:0x1234"sv).takeF64());
  ASSERT_TRUE(Lexer("nan:0x1234"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0xf_ffff_ffff_ffff"sv).takeF32());
  EXPECT_TRUE(Lexer("nan:0xf_ffff_ffff_ffff"sv).takeF64());

  EXPECT_FALSE(Lexer("nanjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("nanjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0xjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0xjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:-0x1"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:-0x1"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:+0x1"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:+0x1"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x0"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x0"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x10_0000_0000_0000"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x10_0000_0000_0000"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x1_0000_0000_0000_0000"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x1_0000_0000_0000_0000"sv).takeF64());

  EXPECT_FALSE(Lexer("NAN"sv).takeF32());
  EXPECT_FALSE(Lexer("NAN"sv).takeF64());

  EXPECT_FALSE(Lexer("NaN"sv).takeF32());
  EXPECT_FALSE(Lexer("NaN"sv).takeF64());
}